

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O1

void * lj_alloc_malloc(void *msp,size_t nsize)

{
  ulong *puVar1;
  void *pvVar2;
  byte *pbVar3;
  void *pvVar4;
  long lVar5;
  bool bVar6;
  ulong uVar7;
  uint uVar8;
  size_t dvs;
  ulong uVar9;
  void *pvVar10;
  long *plVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  ulong *puVar16;
  uint uVar17;
  ulong *puVar18;
  long lVar19;
  long lVar20;
  byte bVar21;
  ulong uVar22;
  ulong *puVar23;
  ulong *puVar24;
  long lVar25;
  void *unaff_R14;
  long lVar26;
  
  if (nsize < 0xf1) {
    uVar14 = 0x20;
    if (0x16 < nsize) {
      uVar14 = (ulong)((int)nsize + 0xfU & 0x1f8);
    }
    uVar8 = *msp;
    bVar21 = (byte)(uVar14 >> 3);
    uVar15 = uVar8 >> (bVar21 & 0x1f);
    if ((uVar15 & 3) != 0) {
      uVar15 = (~uVar15 & 1) + (int)(uVar14 >> 3);
      lVar12 = (long)msp + (ulong)(uVar15 * 0x10) + 0x38;
      lVar19 = *(long *)((long)msp + (ulong)(uVar15 * 0x10) + 0x48);
      lVar26 = *(long *)(lVar19 + 0x10);
      if (lVar12 == lVar26) {
        *(uint *)msp = uVar8 & ~(1 << (uVar15 & 0x1f));
      }
      else {
        *(long *)((long)msp + (ulong)(uVar15 * 0x10) + 0x48) = lVar26;
        *(long *)(lVar26 + 0x18) = lVar12;
      }
      unaff_R14 = (void *)(lVar19 + 0x10);
      *(ulong *)(lVar19 + 8) = (ulong)(uVar15 * 8) + 3;
      pbVar3 = (byte *)(lVar19 + 8 + (ulong)(uVar15 * 8));
      *pbVar3 = *pbVar3 | 1;
      goto LAB_00135306;
    }
    uVar9 = *(ulong *)((long)msp + 8);
    bVar6 = true;
    if (uVar9 < uVar14) {
      if (uVar8 >> (bVar21 & 0x1f) != 0) {
        uVar17 = 2 << (bVar21 & 0x1f);
        uVar17 = (-uVar17 | uVar17) & uVar15 << (bVar21 & 0x1f);
        uVar15 = 0;
        if (uVar17 != 0) {
          for (; (uVar17 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar17 = uVar15 << 4;
        lVar12 = (long)msp + (ulong)uVar17 + 0x38;
        lVar19 = *(long *)((long)msp + (ulong)uVar17 + 0x48);
        lVar26 = *(long *)(lVar19 + 0x10);
        if (lVar12 == lVar26) {
          *(uint *)msp = uVar8 & ~(1 << (uVar15 & 0x1f));
        }
        else {
          *(long *)((long)msp + (ulong)uVar17 + 0x48) = lVar26;
          *(long *)(lVar26 + 0x18) = lVar12;
        }
        unaff_R14 = (void *)(lVar19 + 0x10);
        uVar22 = (ulong)(uVar15 * 8);
        uVar13 = uVar22 - uVar14;
        if (uVar13 < 0x20) {
          *(ulong *)(lVar19 + 8) = uVar22 | 3;
          pbVar3 = (byte *)(lVar19 + 8 + uVar22);
          *pbVar3 = *pbVar3 | 1;
        }
        else {
          *(ulong *)(lVar19 + 8) = uVar14 | 3;
          *(ulong *)(lVar19 + 8 + uVar14) = uVar13 | 1;
          *(ulong *)(lVar19 + uVar22) = uVar13;
          if (uVar9 != 0) {
            lVar26 = *(long *)((long)msp + 0x18);
            uVar9 = uVar9 >> 3;
            lVar12 = (long)msp + uVar9 * 0x10 + 0x38;
            if ((*msp >> ((uint)uVar9 & 0x1f) & 1) == 0) {
              *(uint *)msp = *msp | 1 << ((byte)uVar9 & 0x1f);
              lVar20 = lVar12;
            }
            else {
              lVar20 = *(long *)(lVar12 + 0x10);
            }
            *(long *)(lVar12 + 0x10) = lVar26;
            *(long *)(lVar20 + 0x18) = lVar26;
            *(long *)(lVar26 + 0x10) = lVar20;
            *(long *)(lVar26 + 0x18) = lVar12;
          }
          *(ulong *)((long)msp + 8) = uVar13;
          *(ulong *)((long)msp + 0x18) = lVar19 + uVar14;
        }
        goto LAB_00135306;
      }
      uVar15 = *(uint *)((long)msp + 4);
      if (uVar15 != 0) {
        uVar17 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
          }
        }
        lVar19 = *(long *)((long)msp + (ulong)uVar17 * 8 + 0x248);
        uVar13 = (*(ulong *)(lVar19 + 8) & 0xfffffffffffffffc) - uVar14;
        lVar26 = lVar19;
        while( true ) {
          lVar12 = *(long *)(lVar19 + 0x20);
          if (lVar12 == 0) {
            lVar12 = *(long *)(lVar19 + 0x28);
          }
          if (lVar12 == 0) break;
          uVar22 = (*(ulong *)(lVar12 + 8) & 0xfffffffffffffffc) - uVar14;
          lVar19 = lVar12;
          if (uVar22 < uVar13) {
            uVar13 = uVar22;
            lVar26 = lVar12;
          }
        }
        lVar19 = *(long *)(lVar26 + 0x18);
        lVar12 = *(long *)(lVar26 + 0x30);
        if (lVar19 == lVar26) {
          lVar19 = *(long *)(lVar26 + 0x28);
          if (lVar19 != 0) {
            plVar11 = (long *)(lVar26 + 0x28);
LAB_00135ce4:
            do {
              if (*(long *)(lVar19 + 0x28) == 0) {
                if (*(long *)(lVar19 + 0x20) == 0) goto code_r0x00135cf8;
                plVar11 = (long *)(lVar19 + 0x20);
              }
              else {
                plVar11 = (long *)(lVar19 + 0x28);
              }
              lVar19 = *plVar11;
            } while( true );
          }
          lVar19 = *(long *)(lVar26 + 0x20);
          if (lVar19 != 0) {
            plVar11 = (long *)(lVar26 + 0x20);
            goto LAB_00135ce4;
          }
          lVar19 = 0;
        }
        else {
          lVar20 = *(long *)(lVar26 + 0x10);
          *(long *)(lVar20 + 0x18) = lVar19;
          *(long *)(lVar19 + 0x10) = lVar20;
        }
        goto LAB_00135cff;
      }
    }
    goto LAB_00135431;
  }
  uVar14 = 0xffffffffffffffff;
  if (nsize < 0xffffffffffffff80) {
    uVar14 = nsize + 0xf & 0xfffffffffffffff8;
    uVar8 = *(uint *)((long)msp + 4);
    if (uVar8 != 0) {
      uVar15 = (uint)(nsize + 0xf >> 8);
      if (uVar15 == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0x1f;
        if (uVar15 < 0x10000) {
          uVar17 = 0x1f;
          if (uVar15 != 0) {
            for (; uVar15 >> uVar17 == 0; uVar17 = uVar17 - 1) {
            }
          }
          uVar9 = (ulong)((uVar14 >> ((ulong)(byte)(0x26 - (char)(uVar17 ^ 0x1f)) & 0x3f) & 1) != 0)
                  | (ulong)((uVar17 ^ 0x1f) * 2 ^ 0x3e);
        }
      }
      uVar13 = -uVar14;
      lVar19 = *(long *)((long)msp + uVar9 * 8 + 0x248);
      lVar26 = 0;
      if (lVar19 == 0) {
        lVar19 = 0;
      }
      else {
        bVar21 = 0x39 - (char)(uVar9 >> 1);
        if (uVar9 == 0x1f) {
          bVar21 = 0;
        }
        lVar12 = uVar14 << (bVar21 & 0x3f);
        lVar20 = 0;
        do {
          uVar22 = (*(ulong *)(lVar19 + 8) & 0xfffffffffffffffc) - uVar14;
          if ((uVar22 < uVar13) && (uVar13 = uVar22, lVar26 = lVar19, uVar22 == 0)) {
            bVar6 = false;
            uVar13 = 0;
          }
          else {
            lVar5 = *(long *)(lVar19 + 0x28);
            lVar19 = *(long *)(lVar19 + 0x20 + (lVar12 >> 0x3f) * -8);
            lVar25 = lVar5;
            if (lVar5 == lVar19) {
              lVar25 = lVar20;
            }
            if (lVar5 != 0) {
              lVar20 = lVar25;
            }
            if (lVar19 == 0) {
              bVar6 = false;
              lVar19 = lVar20;
            }
            else {
              lVar12 = lVar12 * 2;
              bVar6 = true;
            }
          }
        } while (bVar6);
      }
      if (lVar19 == 0 && lVar26 == 0) {
        uVar15 = 2 << ((byte)uVar9 & 0x1f);
        uVar15 = (-uVar15 | uVar15) & uVar8;
        if (uVar15 == 0) {
          lVar19 = 0;
        }
        else {
          uVar17 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
            }
          }
          lVar19 = *(long *)((long)msp + (ulong)uVar17 * 8 + 0x248);
        }
      }
      while (lVar12 = lVar19, lVar12 != 0) {
        uVar22 = (*(ulong *)(lVar12 + 8) & 0xfffffffffffffffc) - uVar14;
        uVar9 = uVar22;
        if (uVar13 <= uVar22) {
          uVar9 = uVar13;
        }
        if (uVar13 > uVar22) {
          lVar26 = lVar12;
        }
        uVar13 = uVar9;
        lVar19 = *(long *)(lVar12 + 0x20);
        if (*(long *)(lVar12 + 0x20) == 0) {
          lVar19 = *(long *)(lVar12 + 0x28);
        }
      }
      if ((lVar26 != 0) && (uVar13 < *(long *)((long)msp + 8) - uVar14)) {
        lVar19 = *(long *)(lVar26 + 0x18);
        lVar12 = *(long *)(lVar26 + 0x30);
        if (lVar19 == lVar26) {
          lVar19 = *(long *)(lVar26 + 0x28);
          if (lVar19 != 0) {
            plVar11 = (long *)(lVar26 + 0x28);
LAB_00135975:
            do {
              if (*(long *)(lVar19 + 0x28) == 0) {
                if (*(long *)(lVar19 + 0x20) == 0) goto code_r0x00135989;
                plVar11 = (long *)(lVar19 + 0x20);
              }
              else {
                plVar11 = (long *)(lVar19 + 0x28);
              }
              lVar19 = *plVar11;
            } while( true );
          }
          lVar19 = *(long *)(lVar26 + 0x20);
          if (lVar19 != 0) {
            plVar11 = (long *)(lVar26 + 0x20);
            goto LAB_00135975;
          }
          lVar19 = 0;
        }
        else {
          lVar20 = *(long *)(lVar26 + 0x10);
          *(long *)(lVar20 + 0x18) = lVar19;
          *(long *)(lVar19 + 0x10) = lVar20;
        }
        goto LAB_00135990;
      }
      unaff_R14 = (void *)0x0;
      goto LAB_00135c3d;
    }
  }
  goto LAB_0013543a;
code_r0x00135cf8:
  *plVar11 = 0;
LAB_00135cff:
  if (lVar12 != 0) {
    lVar20 = *(long *)(lVar26 + 0x38);
    if (lVar26 == *(long *)((long)msp + lVar20 * 8 + 0x248)) {
      *(long *)((long)msp + lVar20 * 8 + 0x248) = lVar19;
      if (lVar19 == 0) {
        *(uint *)((long)msp + 4) = uVar15 & ~(1 << ((uint)lVar20 & 0x1f));
        goto LAB_00135d38;
      }
    }
    else {
      if (*(long *)(lVar12 + 0x20) == lVar26) {
        *(long *)(lVar12 + 0x20) = lVar19;
      }
      else {
        *(long *)(lVar12 + 0x28) = lVar19;
      }
LAB_00135d38:
      if (lVar19 == 0) goto LAB_00135d63;
    }
    *(long *)(lVar19 + 0x30) = lVar12;
    lVar12 = *(long *)(lVar26 + 0x20);
    if (lVar12 != 0) {
      *(long *)(lVar19 + 0x20) = lVar12;
      *(long *)(lVar12 + 0x30) = lVar19;
    }
    lVar12 = *(long *)(lVar26 + 0x28);
    if (lVar12 != 0) {
      *(long *)(lVar19 + 0x28) = lVar12;
      *(long *)(lVar12 + 0x30) = lVar19;
    }
  }
LAB_00135d63:
  if (uVar13 < 0x20) {
    *(ulong *)(lVar26 + 8) = uVar13 + uVar14 | 3;
    pbVar3 = (byte *)(lVar26 + 8 + uVar13 + uVar14);
    *pbVar3 = *pbVar3 | 1;
  }
  else {
    *(ulong *)(lVar26 + 8) = uVar14 | 3;
    *(ulong *)(lVar26 + 8 + uVar14) = uVar13 | 1;
    *(ulong *)(lVar26 + uVar14 + uVar13) = uVar13;
    if (uVar9 != 0) {
      lVar19 = *(long *)((long)msp + 0x18);
      uVar9 = uVar9 >> 3;
      lVar12 = (long)msp + uVar9 * 0x10 + 0x38;
      if ((uVar8 >> ((uint)uVar9 & 0x1f) & 1) == 0) {
        *(uint *)msp = 1 << ((byte)uVar9 & 0x1f) | uVar8;
        lVar20 = lVar12;
      }
      else {
        lVar20 = *(long *)((long)msp + uVar9 * 0x10 + 0x48);
      }
      *(long *)((long)msp + uVar9 * 0x10 + 0x48) = lVar19;
      *(long *)(lVar20 + 0x18) = lVar19;
      *(long *)(lVar19 + 0x10) = lVar20;
      *(long *)(lVar19 + 0x18) = lVar12;
    }
    *(ulong *)((long)msp + 8) = uVar13;
    *(ulong *)((long)msp + 0x18) = lVar26 + uVar14;
  }
  unaff_R14 = (void *)(lVar26 + 0x10);
LAB_00135306:
  bVar6 = false;
LAB_00135431:
  if (!bVar6) {
    return unaff_R14;
  }
  goto LAB_0013543a;
LAB_00135e49:
  if (*(long *)(lVar20 + 0x28) == 0) {
    if (*(long *)(lVar20 + 0x20) == 0) goto code_r0x00135e5d;
    plVar11 = (long *)(lVar20 + 0x20);
  }
  else {
    plVar11 = (long *)(lVar20 + 0x28);
  }
  lVar20 = *plVar11;
  goto LAB_00135e49;
code_r0x00135e5d:
  *plVar11 = 0;
LAB_00135e64:
  if (lVar5 != 0) {
    lVar25 = *(long *)(lVar12 + 0x38);
    if (lVar12 == *(long *)((long)msp + lVar25 * 8 + 0x248)) {
      *(long *)((long)msp + lVar25 * 8 + 0x248) = lVar20;
      if (lVar20 == 0) {
        bVar21 = (byte)lVar25 & 0x1f;
        *(uint *)((long)msp + 4) =
             *(uint *)((long)msp + 4) & (-2 << bVar21 | 0xfffffffeU >> 0x20 - bVar21);
        goto LAB_00135ea3;
      }
    }
    else {
      if (*(long *)(lVar5 + 0x20) == lVar12) {
        *(long *)(lVar5 + 0x20) = lVar20;
      }
      else {
        *(long *)(lVar5 + 0x28) = lVar20;
      }
LAB_00135ea3:
      if (lVar20 == 0) goto LAB_00135ece;
    }
    *(long *)(lVar20 + 0x30) = lVar5;
    lVar5 = *(long *)(lVar12 + 0x20);
    if (lVar5 != 0) {
      *(long *)(lVar20 + 0x20) = lVar5;
      *(long *)(lVar5 + 0x30) = lVar20;
    }
    lVar5 = *(long *)(lVar12 + 0x28);
    if (lVar5 != 0) {
      *(long *)(lVar20 + 0x28) = lVar5;
      *(long *)(lVar5 + 0x30) = lVar20;
    }
  }
LAB_00135ece:
  lVar12 = lVar12 + (uVar14 & 0xfffffffffffffffc);
  uVar9 = uVar9 + (uVar14 & 0xfffffffffffffffc);
LAB_00135ed4:
  *(byte *)(lVar12 + 8) = *(byte *)(lVar12 + 8) & 0xfe;
  *(ulong *)(lVar26 + 8) = uVar9 | 1;
  *(ulong *)(lVar26 + uVar9) = uVar9;
  if (uVar9 < 0x100) {
    uVar9 = uVar9 >> 3;
    lVar12 = (long)msp + uVar9 * 0x10 + 0x38;
    if ((*msp >> ((uint)uVar9 & 0x1f) & 1) == 0) {
      *(uint *)msp = *msp | 1 << ((byte)uVar9 & 0x1f);
      lVar20 = lVar12;
    }
    else {
      lVar20 = *(long *)((long)msp + uVar9 * 0x10 + 0x48);
    }
    *(long *)((long)msp + uVar9 * 0x10 + 0x48) = lVar26;
    *(long *)(lVar20 + 0x18) = lVar26;
    *(long *)(lVar26 + 0x10) = lVar20;
    *(long *)(lVar26 + 0x18) = lVar12;
  }
  else {
    uVar8 = (uint)(uVar9 >> 8);
    if (uVar8 == 0) {
      uVar14 = 0;
    }
    else {
      uVar14 = 0x1f;
      if (uVar8 < 0x10000) {
        uVar15 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> uVar15 == 0; uVar15 = uVar15 - 1) {
          }
        }
        uVar14 = (ulong)((uVar9 >> ((ulong)(byte)(0x26 - (char)(uVar15 ^ 0x1f)) & 0x3f) & 1) != 0) |
                 (ulong)((uVar15 ^ 0x1f) * 2 ^ 0x3e);
      }
    }
    plVar11 = (long *)((long)msp + uVar14 * 8 + 0x248);
    *(ulong *)(lVar26 + 0x38) = uVar14;
    *(undefined8 *)(lVar26 + 0x20) = 0;
    *(undefined8 *)(lVar26 + 0x28) = 0;
    if ((*(uint *)((long)msp + 4) >> ((uint)uVar14 & 0x1f) & 1) == 0) {
      *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar14 & 0x1f);
      *plVar11 = lVar26;
      *(long **)(lVar26 + 0x30) = plVar11;
      *(long *)(lVar26 + 0x18) = lVar26;
      *(long *)(lVar26 + 0x10) = lVar26;
    }
    else {
      lVar12 = *plVar11;
      bVar21 = 0x39 - (char)(uVar14 >> 1);
      if (uVar14 == 0x1f) {
        bVar21 = 0;
      }
      lVar20 = uVar9 << (bVar21 & 0x3f);
      do {
        if ((*(ulong *)(lVar12 + 8) & 0xfffffffffffffffc) == uVar9) {
          lVar20 = *(long *)(lVar12 + 0x10);
          *(long *)(lVar20 + 0x18) = lVar26;
          *(long *)(lVar12 + 0x10) = lVar26;
          *(long *)(lVar26 + 0x10) = lVar20;
          *(long *)(lVar26 + 0x18) = lVar12;
          *(undefined8 *)(lVar26 + 0x30) = 0;
          break;
        }
        lVar5 = *(long *)(lVar12 + 0x20 + (lVar20 >> 0x3f) * -8);
        lVar25 = lVar5;
        if (lVar5 == 0) {
          *(long *)(lVar12 + 0x20 + (lVar20 >> 0x3f) * -8) = lVar26;
          *(long *)(lVar26 + 0x30) = lVar12;
          *(long *)(lVar26 + 0x18) = lVar26;
          *(long *)(lVar26 + 0x10) = lVar26;
          lVar25 = lVar12;
        }
        lVar12 = lVar25;
        lVar20 = lVar20 * 2;
      } while (lVar5 != 0);
    }
  }
  goto LAB_00135cb1;
code_r0x00135989:
  *plVar11 = 0;
LAB_00135990:
  if (lVar12 != 0) {
    lVar20 = *(long *)(lVar26 + 0x38);
    if (lVar26 == *(long *)((long)msp + lVar20 * 8 + 0x248)) {
      *(long *)((long)msp + lVar20 * 8 + 0x248) = lVar19;
      if (lVar19 == 0) {
        *(uint *)((long)msp + 4) = uVar8 & ~(1 << ((uint)lVar20 & 0x1f));
        goto LAB_001359c1;
      }
    }
    else {
      if (*(long *)(lVar12 + 0x20) == lVar26) {
        *(long *)(lVar12 + 0x20) = lVar19;
      }
      else {
        *(long *)(lVar12 + 0x28) = lVar19;
      }
LAB_001359c1:
      if (lVar19 == 0) goto LAB_001359ec;
    }
    *(long *)(lVar19 + 0x30) = lVar12;
    lVar12 = *(long *)(lVar26 + 0x20);
    if (lVar12 != 0) {
      *(long *)(lVar19 + 0x20) = lVar12;
      *(long *)(lVar12 + 0x30) = lVar19;
    }
    lVar12 = *(long *)(lVar26 + 0x28);
    if (lVar12 != 0) {
      *(long *)(lVar19 + 0x28) = lVar12;
      *(long *)(lVar12 + 0x30) = lVar19;
    }
  }
LAB_001359ec:
  if (uVar13 < 0x20) {
    *(ulong *)(lVar26 + 8) = uVar13 + uVar14 | 3;
    pbVar3 = (byte *)(lVar26 + 8 + uVar13 + uVar14);
    *pbVar3 = *pbVar3 | 1;
  }
  else {
    lVar19 = lVar26 + uVar14;
    *(ulong *)(lVar26 + 8) = uVar14 | 3;
    *(ulong *)(lVar26 + 8 + uVar14) = uVar13 | 1;
    *(ulong *)(lVar19 + uVar13) = uVar13;
    if (uVar13 < 0x100) {
      uVar13 = uVar13 >> 3;
      lVar12 = (long)msp + uVar13 * 0x10 + 0x38;
      if ((*msp >> ((uint)uVar13 & 0x1f) & 1) == 0) {
        *(uint *)msp = *msp | 1 << ((byte)uVar13 & 0x1f);
        lVar20 = lVar12;
      }
      else {
        lVar20 = *(long *)((long)msp + uVar13 * 0x10 + 0x48);
      }
      *(long *)((long)msp + uVar13 * 0x10 + 0x48) = lVar19;
      *(long *)(lVar20 + 0x18) = lVar19;
      *(long *)(lVar19 + 0x10) = lVar20;
      *(long *)(lVar19 + 0x18) = lVar12;
    }
    else {
      uVar8 = (uint)(uVar13 >> 8);
      if (uVar8 == 0) {
        uVar9 = 0;
      }
      else {
        uVar9 = 0x1f;
        if (uVar8 < 0x10000) {
          uVar15 = 0x1f;
          if (uVar8 != 0) {
            for (; uVar8 >> uVar15 == 0; uVar15 = uVar15 - 1) {
            }
          }
          uVar9 = (ulong)((uint)((uVar13 >> ((ulong)(byte)(0x26 - (char)(uVar15 ^ 0x1f)) & 0x3f) & 1
                                 ) != 0) | (uVar15 ^ 0x1f) * 2 ^ 0x3e);
        }
      }
      plVar11 = (long *)((long)msp + uVar9 * 8 + 0x248);
      *(ulong *)(lVar19 + 0x38) = uVar9;
      *(undefined8 *)(lVar19 + 0x20) = 0;
      *(undefined8 *)(lVar19 + 0x28) = 0;
      if ((*(uint *)((long)msp + 4) >> ((uint)uVar9 & 0x1f) & 1) == 0) {
        *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar9 & 0x1f);
        *plVar11 = lVar19;
        *(long **)(lVar19 + 0x30) = plVar11;
        *(long *)(lVar19 + 0x18) = lVar19;
        *(long *)(lVar19 + 0x10) = lVar19;
      }
      else {
        lVar12 = *plVar11;
        bVar21 = 0x39 - (char)(uVar9 >> 1);
        if (uVar9 == 0x1f) {
          bVar21 = 0;
        }
        lVar20 = uVar13 << (bVar21 & 0x3f);
        do {
          if ((*(ulong *)(lVar12 + 8) & 0xfffffffffffffffc) == uVar13) {
            lVar20 = *(long *)(lVar12 + 0x10);
            *(long *)(lVar20 + 0x18) = lVar19;
            *(long *)(lVar12 + 0x10) = lVar19;
            *(long *)(lVar19 + 0x10) = lVar20;
            *(long *)(lVar19 + 0x18) = lVar12;
            *(undefined8 *)(lVar19 + 0x30) = 0;
            break;
          }
          lVar5 = *(long *)(lVar12 + 0x20 + (lVar20 >> 0x3f) * -8);
          lVar25 = lVar5;
          if (lVar5 == 0) {
            *(long *)(lVar12 + 0x20 + (lVar20 >> 0x3f) * -8) = lVar19;
            *(long *)(lVar19 + 0x30) = lVar12;
            *(long *)(lVar19 + 0x18) = lVar19;
            *(long *)(lVar19 + 0x10) = lVar19;
            lVar25 = lVar12;
          }
          lVar12 = lVar25;
          lVar20 = lVar20 * 2;
        } while (lVar5 != 0);
      }
    }
  }
  unaff_R14 = (void *)(lVar26 + 0x10);
LAB_00135c3d:
  if (unaff_R14 != (void *)0x0) {
    return unaff_R14;
  }
LAB_0013543a:
  uVar9 = *(ulong *)((long)msp + 8);
  uVar13 = uVar9 - uVar14;
  if (uVar9 < uVar14) {
    uVar9 = *(ulong *)((long)msp + 0x10) - uVar14;
    if (*(ulong *)((long)msp + 0x10) < uVar14 || uVar9 == 0) {
      if ((0x1ffff < uVar14) &&
         (unaff_R14 = direct_alloc((mstate)msp,uVar14), unaff_R14 != (void *)0x0)) {
        return unaff_R14;
      }
      uVar9 = uVar14 + 0x20040 & 0xfffffffffffe0000;
      if (uVar14 < uVar9) {
        pvVar10 = mmap_probe(*(PRNGState **)((long)msp + 0x360),uVar9);
        uVar13 = 0;
        if (pvVar10 != (void *)0xffffffffffffffff) {
          uVar13 = uVar9;
        }
      }
      else {
        pvVar10 = (void *)0xffffffffffffffff;
        uVar13 = 0;
      }
      if (pvVar10 != (void *)0xffffffffffffffff) {
        puVar18 = (ulong *)((long)msp + 0x348);
        puVar16 = puVar18;
        do {
          pvVar2 = (void *)((long)*puVar16 + puVar16[1]);
          if (pvVar10 == pvVar2) {
            pvVar4 = *(void **)((long)msp + 0x20);
            if (pvVar4 < pvVar2 && (void *)*puVar16 <= pvVar4) {
              puVar16[1] = puVar16[1] + uVar13;
              lVar19 = uVar13 + *(long *)((long)msp + 0x10);
              uVar9 = (ulong)(-(int)pvVar4 - 0x10U & 7);
              uVar13 = lVar19 - uVar9;
              *(ulong *)((long)msp + 0x20) = (long)pvVar4 + uVar9;
              *(ulong *)((long)msp + 0x10) = uVar13;
              *(ulong *)((long)pvVar4 + uVar9 + 8) = uVar13 | 1;
              *(undefined8 *)((long)pvVar4 + lVar19 + 8) = 0x40;
              *(undefined8 *)((long)msp + 0x28) = 0x200000;
              goto LAB_00135c85;
            }
            break;
          }
          puVar16 = (ulong *)puVar16[2];
        } while (puVar16 != (ulong *)0x0);
        puVar16 = puVar18;
        do {
          uVar9 = *puVar16;
          if (uVar9 == (long)pvVar10 + uVar13) {
            *puVar16 = (ulong)pvVar10;
            puVar16[1] = puVar16[1] + uVar13;
            uVar13 = (ulong)(-(int)pvVar10 - 0x10U & 7);
            lVar19 = (long)pvVar10 + uVar13;
            lVar12 = (-(int)uVar9 - 0x10U & 7) + uVar9;
            lVar26 = lVar19 + uVar14;
            uVar9 = lVar12 - lVar26;
            *(ulong *)((long)pvVar10 + uVar13 + 8) = uVar14 | 3;
            if (lVar12 == *(long *)((long)msp + 0x20)) {
              uVar9 = uVar9 + *(long *)((long)msp + 0x10);
              *(ulong *)((long)msp + 0x10) = uVar9;
              *(long *)((long)msp + 0x20) = lVar26;
              *(ulong *)(lVar26 + 8) = uVar9 | 1;
              goto LAB_00135cb1;
            }
            if (lVar12 == *(long *)((long)msp + 0x18)) {
              uVar9 = uVar9 + *(long *)((long)msp + 8);
              *(ulong *)((long)msp + 8) = uVar9;
              *(long *)((long)msp + 0x18) = lVar26;
              *(ulong *)(lVar26 + 8) = uVar9 | 1;
              *(ulong *)(lVar26 + uVar9) = uVar9;
              goto LAB_00135cb1;
            }
            uVar14 = *(ulong *)(lVar12 + 8);
            if ((uVar14 & 2) != 0) goto LAB_00135ed4;
            lVar20 = *(long *)(lVar12 + 0x18);
            if (uVar14 < 0x100) {
              lVar5 = *(long *)(lVar12 + 0x10);
              if (lVar5 == lVar20) {
                bVar21 = (byte)(uVar14 >> 3) & 0x1f;
                *(uint *)msp = *msp & (-2 << bVar21 | 0xfffffffeU >> 0x20 - bVar21);
              }
              else {
                *(long *)(lVar5 + 0x18) = lVar20;
                *(long *)(lVar20 + 0x10) = lVar5;
              }
              goto LAB_00135ece;
            }
            lVar5 = *(long *)(lVar12 + 0x30);
            if (lVar20 != lVar12) {
              lVar25 = *(long *)(lVar12 + 0x10);
              *(long *)(lVar25 + 0x18) = lVar20;
              *(long *)(lVar20 + 0x10) = lVar25;
              goto LAB_00135e64;
            }
            lVar20 = *(long *)(lVar12 + 0x28);
            if (lVar20 != 0) {
              plVar11 = (long *)(lVar12 + 0x28);
              goto LAB_00135e49;
            }
            lVar20 = *(long *)(lVar12 + 0x20);
            if (lVar20 != 0) {
              plVar11 = (long *)(lVar12 + 0x20);
              goto LAB_00135e49;
            }
            lVar20 = 0;
            goto LAB_00135e64;
          }
          puVar16 = (ulong *)puVar16[2];
        } while (puVar16 != (ulong *)0x0);
        puVar16 = *(ulong **)((long)msp + 0x20);
        for (puVar24 = puVar18;
            (puVar16 < (ulong *)*puVar24 ||
            (puVar23 = (ulong *)((long)*puVar24 + puVar24[1]), puVar23 <= puVar16));
            puVar24 = (ulong *)puVar24[2]) {
        }
        puVar24 = (ulong *)((long)puVar23 + ((ulong)(0x37U - (int)puVar23 & 7) - 0x47));
        if (puVar24 < puVar16 + 4) {
          puVar24 = puVar16;
        }
        uVar22 = (ulong)(-(int)pvVar10 - 0x10U & 7);
        uVar9 = (uVar13 - 0x40) - uVar22;
        *(ulong *)((long)msp + 0x20) = (long)pvVar10 + uVar22;
        *(ulong *)((long)msp + 0x10) = uVar9;
        *(ulong *)((long)pvVar10 + uVar22 + 8) = uVar9 | 1;
        *(undefined8 *)((long)pvVar10 + (uVar13 - 0x38)) = 0x40;
        *(undefined8 *)((long)msp + 0x28) = 0x200000;
        puVar24[1] = 0x23;
        uVar9 = *(ulong *)((long)msp + 0x350);
        puVar24[2] = *puVar18;
        puVar24[3] = uVar9;
        puVar24[4] = *(ulong *)((long)msp + 0x358);
        *(void **)((long)msp + 0x348) = pvVar10;
        *(ulong *)((long)msp + 0x350) = uVar13;
        *(ulong **)((long)msp + 0x358) = puVar24 + 2;
        puVar18 = puVar24 + 4;
        do {
          puVar18[1] = 0xb;
          puVar1 = puVar18 + 2;
          puVar18 = puVar18 + 1;
        } while (puVar1 < puVar23);
        uVar9 = (long)puVar24 - (long)puVar16;
        if (uVar9 != 0) {
          *(byte *)(puVar24 + 1) = (byte)puVar24[1] & 0xfe;
          puVar16[1] = uVar9 | 1;
          *puVar24 = uVar9;
          if (uVar9 < 0x100) {
            uVar9 = uVar9 >> 3;
            uVar13 = (long)msp + uVar9 * 0x10 + 0x38;
            if ((*msp >> ((uint)uVar9 & 0x1f) & 1) == 0) {
              *(uint *)msp = *msp | 1 << ((byte)uVar9 & 0x1f);
              uVar22 = uVar13;
            }
            else {
              uVar22 = *(ulong *)((long)msp + uVar9 * 0x10 + 0x48);
            }
            *(ulong **)((long)msp + uVar9 * 0x10 + 0x48) = puVar16;
            *(ulong **)(uVar22 + 0x18) = puVar16;
            puVar16[2] = uVar22;
            puVar16[3] = uVar13;
          }
          else {
            uVar8 = (uint)(uVar9 >> 8);
            if (uVar8 == 0) {
              uVar13 = 0;
            }
            else {
              uVar13 = 0x1f;
              if (uVar8 < 0x10000) {
                uVar15 = 0x1f;
                if (uVar8 != 0) {
                  for (; uVar8 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                  }
                }
                uVar13 = (ulong)((uint)((uVar9 >> ((ulong)(byte)(0x26 - (char)(uVar15 ^ 0x1f)) &
                                                  0x3f) & 1) != 0) | (uVar15 ^ 0x1f) * 2 ^ 0x3e);
              }
            }
            puVar18 = (ulong *)((long)msp + uVar13 * 8 + 0x248);
            puVar16[7] = uVar13;
            puVar16[4] = 0;
            puVar16[5] = 0;
            if ((*(uint *)((long)msp + 4) >> ((uint)uVar13 & 0x1f) & 1) == 0) {
              *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar13 & 0x1f);
              *puVar18 = (ulong)puVar16;
              puVar16[6] = (ulong)puVar18;
              puVar16[3] = (ulong)puVar16;
              puVar16[2] = (ulong)puVar16;
            }
            else {
              uVar22 = *puVar18;
              bVar21 = 0x39 - (char)(uVar13 >> 1);
              if (uVar13 == 0x1f) {
                bVar21 = 0;
              }
              lVar19 = uVar9 << (bVar21 & 0x3f);
              do {
                if ((*(ulong *)(uVar22 + 8) & 0xfffffffffffffffc) == uVar9) {
                  uVar9 = *(ulong *)(uVar22 + 0x10);
                  *(ulong **)(uVar9 + 0x18) = puVar16;
                  *(ulong **)(uVar22 + 0x10) = puVar16;
                  puVar16[2] = uVar9;
                  puVar16[3] = uVar22;
                  puVar16[6] = 0;
                  break;
                }
                uVar13 = *(ulong *)(uVar22 + 0x20 + (lVar19 >> 0x3f) * -8);
                uVar7 = uVar13;
                if (uVar13 == 0) {
                  *(ulong **)(uVar22 + 0x20 + (lVar19 >> 0x3f) * -8) = puVar16;
                  puVar16[6] = uVar22;
                  puVar16[3] = (ulong)puVar16;
                  puVar16[2] = (ulong)puVar16;
                  uVar7 = uVar22;
                }
                uVar22 = uVar7;
                lVar19 = lVar19 * 2;
              } while (uVar13 != 0);
            }
          }
        }
LAB_00135c85:
        bVar6 = true;
        uVar9 = *(ulong *)((long)msp + 0x10) - uVar14;
        if (uVar14 <= *(ulong *)((long)msp + 0x10) && uVar9 != 0) {
          *(ulong *)((long)msp + 0x10) = uVar9;
          lVar19 = *(long *)((long)msp + 0x20);
          *(ulong *)((long)msp + 0x20) = lVar19 + uVar14;
          *(ulong *)(lVar19 + 8 + uVar14) = uVar9 | 1;
          *(ulong *)(lVar19 + 8) = uVar14 | 3;
LAB_00135cb1:
          unaff_R14 = (void *)(lVar19 + 0x10);
          bVar6 = false;
        }
        if (!bVar6) {
          return unaff_R14;
        }
      }
      return (void *)0x0;
    }
    *(ulong *)((long)msp + 0x10) = uVar9;
    lVar19 = *(long *)((long)msp + 0x20);
    *(ulong *)((long)msp + 0x20) = lVar19 + uVar14;
    *(ulong *)(lVar19 + 8 + uVar14) = uVar9 | 1;
  }
  else {
    lVar19 = *(long *)((long)msp + 0x18);
    if (uVar13 < 0x20) {
      *(undefined8 *)((long)msp + 8) = 0;
      *(undefined8 *)((long)msp + 0x18) = 0;
      *(ulong *)(lVar19 + 8) = uVar9 | 3;
      pbVar3 = (byte *)(lVar19 + 8 + uVar9);
      *pbVar3 = *pbVar3 | 1;
      goto LAB_0013552b;
    }
    *(ulong *)((long)msp + 0x18) = lVar19 + uVar14;
    *(ulong *)((long)msp + 8) = uVar13;
    *(ulong *)(lVar19 + 8 + uVar14) = uVar13 | 1;
    *(ulong *)(lVar19 + uVar9) = uVar13;
  }
  *(ulong *)(lVar19 + 8) = uVar14 | 3;
LAB_0013552b:
  return (void *)(lVar19 + 0x10);
}

Assistant:

static LJ_NOINLINE void *lj_alloc_malloc(void *msp, size_t nsize)
{
  mstate ms = (mstate)msp;
  void *mem;
  size_t nb;
  if (nsize <= MAX_SMALL_REQUEST) {
    bindex_t idx;
    binmap_t smallbits;
    nb = (nsize < MIN_REQUEST)? MIN_CHUNK_SIZE : pad_request(nsize);
    idx = small_index(nb);
    smallbits = ms->smallmap >> idx;

    if ((smallbits & 0x3U) != 0) { /* Remainderless fit to a smallbin. */
      mchunkptr b, p;
      idx += ~smallbits & 1;       /* Uses next bin if idx empty */
      b = smallbin_at(ms, idx);
      p = b->fd;
      unlink_first_small_chunk(ms, b, p, idx);
      set_inuse_and_pinuse(ms, p, small_index2size(idx));
      mem = chunk2mem(p);
      return mem;
    } else if (nb > ms->dvsize) {
      if (smallbits != 0) { /* Use chunk in next nonempty smallbin */
	mchunkptr b, p, r;
	size_t rsize;
	binmap_t leftbits = (smallbits << idx) & left_bits(idx2bit(idx));
	bindex_t i = lj_ffs(leftbits);
	b = smallbin_at(ms, i);
	p = b->fd;
	unlink_first_small_chunk(ms, b, p, i);
	rsize = small_index2size(i) - nb;
	/* Fit here cannot be remainderless if 4byte sizes */
	if (SIZE_T_SIZE != 4 && rsize < MIN_CHUNK_SIZE) {
	  set_inuse_and_pinuse(ms, p, small_index2size(i));
	} else {
	  set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
	  r = chunk_plus_offset(p, nb);
	  set_size_and_pinuse_of_free_chunk(r, rsize);
	  replace_dv(ms, r, rsize);
	}
	mem = chunk2mem(p);
	return mem;
      } else if (ms->treemap != 0 && (mem = tmalloc_small(ms, nb)) != 0) {
	return mem;
      }
    }
  } else if (nsize >= MAX_REQUEST) {
    nb = MAX_SIZE_T; /* Too big to allocate. Force failure (in sys alloc) */
  } else {
    nb = pad_request(nsize);
    if (ms->treemap != 0 && (mem = tmalloc_large(ms, nb)) != 0) {
      return mem;
    }
  }

  if (nb <= ms->dvsize) {
    size_t rsize = ms->dvsize - nb;
    mchunkptr p = ms->dv;
    if (rsize >= MIN_CHUNK_SIZE) { /* split dv */
      mchunkptr r = ms->dv = chunk_plus_offset(p, nb);
      ms->dvsize = rsize;
      set_size_and_pinuse_of_free_chunk(r, rsize);
      set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    } else { /* exhaust dv */
      size_t dvs = ms->dvsize;
      ms->dvsize = 0;
      ms->dv = 0;
      set_inuse_and_pinuse(ms, p, dvs);
    }
    mem = chunk2mem(p);
    return mem;
  } else if (nb < ms->topsize) { /* Split top */
    size_t rsize = ms->topsize -= nb;
    mchunkptr p = ms->top;
    mchunkptr r = ms->top = chunk_plus_offset(p, nb);
    r->head = rsize | PINUSE_BIT;
    set_size_and_pinuse_of_inuse_chunk(ms, p, nb);
    mem = chunk2mem(p);
    return mem;
  }
  return alloc_sys(ms, nb);
}